

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QControlledGate2.hpp
# Opt level: O3

void __thiscall
qclab::qgates::QControlledGate2<std::complex<double>_>::QControlledGate2
          (QControlledGate2<std::complex<double>_> *this,int control,int controlState)

{
  (this->super_QGate2<std::complex<double>_>).super_QObject<std::complex<double>_>._vptr_QObject =
       (_func_int **)&PTR_nbQubits_001280e0;
  this->control_ = control;
  this->controlState_ = controlState;
  if (control < 0) {
    __assert_fail("control >= 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O3/_deps/qclabpp-src/include/qclab/qgates/QControlledGate2.hpp"
                  ,0x22,
                  "qclab::qgates::QControlledGate2<std::complex<double>>::QControlledGate2(const int, const int) [T = std::complex<double>]"
                 );
  }
  if ((uint)controlState < 2) {
    return;
  }
  __assert_fail("( controlState == 0 ) || ( controlState == 1 )",
                "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O3/_deps/qclabpp-src/include/qclab/qgates/QControlledGate2.hpp"
                ,0x23,
                "qclab::qgates::QControlledGate2<std::complex<double>>::QControlledGate2(const int, const int) [T = std::complex<double>]"
               );
}

Assistant:

QControlledGate2( const int control , const int controlState = 1 )
        : control_( control )
        , controlState_( controlState )
        {
          assert( control >= 0 ) ;
          assert( ( controlState == 0 ) || ( controlState == 1 ) ) ;
        }